

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

size_t __thiscall
cmGlobalUnixMakefileGenerator3::CountProgressMarksInAll
          (cmGlobalUnixMakefileGenerator3 *this,cmLocalGenerator *lg)

{
  mapped_type *pmVar1;
  size_t sVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  size_t sVar5;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  emitted;
  cmStateSnapshot local_70;
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_58;
  
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  cmLocalGenerator::GetStateSnapshot(&local_70,lg);
  pmVar1 = std::
           map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
           ::operator[](&this->DirectoryTargetsMap,&local_70);
  p_Var3 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
  sVar5 = 0;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      sVar2 = CountProgressMarksInTarget
                        (this,*(cmGeneratorTarget **)(p_Var3 + 1),
                         (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                          *)&local_58);
      sVar5 = sVar5 + sVar2;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree(&local_58);
  return sVar5;
}

Assistant:

size_t cmGlobalUnixMakefileGenerator3::CountProgressMarksInAll(
  cmLocalGenerator* lg)
{
  size_t count = 0;
  std::set<cmGeneratorTarget const*> emitted;
  std::set<cmGeneratorTarget const*> const& targets =
    this->DirectoryTargetsMap[lg->GetStateSnapshot()];
  for (std::set<cmGeneratorTarget const*>::const_iterator t = targets.begin();
       t != targets.end(); ++t) {
    count += this->CountProgressMarksInTarget(*t, emitted);
  }
  return count;
}